

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

void __thiscall
pstore::indirect_string_adder::flush(indirect_string_adder *this,transaction_base *transaction)

{
  pointer ppVar1;
  typed_address<pstore::address> address_to_patch;
  pointer ppVar2;
  
  ppVar2 = (this->views_).
           super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->views_).
           super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar2 == ppVar1) {
      ppVar2 = (this->views_).
               super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->views_).
          super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
        (this->views_).
        super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      return;
    }
    address_to_patch.a_.a_ = (address)(ppVar2->second).a_.a_;
    if (address_to_patch.a_.a_ == 0) break;
    indirect_string::write_body_and_patch_address(transaction,ppVar2->first,address_to_patch);
    ppVar2 = ppVar2 + 1;
  }
  assert_failed("v.second != typed_address<address>::null ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                ,0xa1);
}

Assistant:

void indirect_string_adder::flush (transaction_base & transaction) {
        for (auto const & v : views_) {
            PSTORE_ASSERT (v.second != typed_address<address>::null ());
            indirect_string::write_body_and_patch_address (transaction,
                                                           *std::get<0> (v), // string body
                                                           std::get<1> (v)   // address to patch
            );
        }
        views_.clear ();
    }